

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceSpec.cxx
# Opt level: O1

bool __thiscall cmCTestResourceSpec::Resource::operator==(Resource *this,Resource *other)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  __n = (this->Id)._M_string_length;
  if (__n == (other->Id)._M_string_length) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((this->Id)._M_dataplus._M_p,(other->Id)._M_dataplus._M_p,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return (bool)(this->Capacity == other->Capacity & bVar2);
}

Assistant:

bool cmCTestResourceSpec::Resource::operator==(
  const cmCTestResourceSpec::Resource& other) const
{
  return this->Id == other.Id && this->Capacity == other.Capacity;
}